

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O2

void brotli::RecomputeDistancePrefixes
               (Command *cmds,size_t num_commands,uint32_t num_direct_distance_codes,
               uint32_t distance_postfix_bits)

{
  uint32_t uVar1;
  uint16_t *code;
  bool bVar2;
  
  if (distance_postfix_bits != 0 || num_direct_distance_codes != 0) {
    code = &cmds->dist_prefix_;
    while (bVar2 = num_commands != 0, num_commands = num_commands - 1, bVar2) {
      if ((*(uint32_t *)(code + -9) != 0) && (0x7f < code[-1])) {
        uVar1 = Command::DistanceCode((Command *)(code + -0xb));
        PrefixEncodeCopyDistance
                  ((ulong)uVar1,(ulong)num_direct_distance_codes,(ulong)distance_postfix_bits,code,
                   (uint32_t *)(code + -3));
      }
      code = code + 0xc;
    }
  }
  return;
}

Assistant:

void RecomputeDistancePrefixes(Command* cmds,
                               size_t num_commands,
                               uint32_t num_direct_distance_codes,
                               uint32_t distance_postfix_bits) {
  if (num_direct_distance_codes == 0 && distance_postfix_bits == 0) {
    return;
  }
  for (size_t i = 0; i < num_commands; ++i) {
    Command* cmd = &cmds[i];
    if (cmd->copy_len_ > 0 && cmd->cmd_prefix_ >= 128) {
      PrefixEncodeCopyDistance(cmd->DistanceCode(),
                               num_direct_distance_codes,
                               distance_postfix_bits,
                               &cmd->dist_prefix_,
                               &cmd->dist_extra_);
    }
  }
}